

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::AddBoneChildren(SMDImporter *this,aiNode *pcNode,uint32_t iParent)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  pointer pMVar33;
  pointer pBVar34;
  uint uVar35;
  aiNode **ppaVar36;
  ulong uVar37;
  aiNode *this_00;
  pointer pBVar38;
  ulong uVar39;
  uint local_78;
  
  if (pcNode == (aiNode *)0x0) {
    __assert_fail("nullptr != pcNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19a,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  if (pcNode->mNumChildren == 0) {
    if (pcNode->mChildren == (aiNode **)0x0) {
      pBVar38 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
          _M_impl.super__Vector_impl_data._M_finish != pBVar38) {
        uVar35 = 1;
        uVar37 = 0;
        do {
          if (pBVar38[uVar37].iParent == iParent) {
            pcNode->mNumChildren = pcNode->mNumChildren + 1;
          }
          uVar37 = (ulong)uVar35;
          pBVar38 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar39 = ((long)(this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pBVar38 >> 4) *
                   -0x71c71c71c71c71c7;
          uVar35 = uVar35 + 1;
        } while (uVar37 <= uVar39 && uVar39 - uVar37 != 0);
      }
      ppaVar36 = (aiNode **)operator_new__((ulong)pcNode->mNumChildren << 3);
      pcNode->mChildren = ppaVar36;
      pBVar38 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
          _M_impl.super__Vector_impl_data._M_finish != pBVar38) {
        uVar37 = 0;
        uVar35 = 1;
        local_78 = 0;
        do {
          if (pBVar38[uVar37].iParent == iParent) {
            this_00 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(this_00);
            pBVar38 = pBVar38 + uVar37;
            pcNode->mChildren[local_78] = this_00;
            uVar37 = (pBVar38->mName)._M_string_length;
            if (uVar37 < 0x400) {
              (this_00->mName).length = (ai_uint32)uVar37;
              memcpy((this_00->mName).data,(pBVar38->mName)._M_dataplus._M_p,uVar37);
              (this_00->mName).data[uVar37] = '\0';
            }
            pMVar33 = (pBVar38->sAnim).asKeys.
                      super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pBVar38->sAnim).asKeys.
                super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                ._M_impl.super__Vector_impl_data._M_finish != pMVar33) {
              fVar12 = (pMVar33->matrix).a1;
              fVar13 = (pMVar33->matrix).a2;
              fVar14 = (pMVar33->matrix).a3;
              fVar15 = (pMVar33->matrix).a4;
              fVar8 = (pMVar33->matrix).b1;
              fVar9 = (pMVar33->matrix).b2;
              fVar10 = (pMVar33->matrix).b3;
              fVar11 = (pMVar33->matrix).b4;
              fVar4 = (pMVar33->matrix).c1;
              fVar5 = (pMVar33->matrix).c2;
              fVar6 = (pMVar33->matrix).c3;
              fVar7 = (pMVar33->matrix).c4;
              fVar1 = (pMVar33->matrix).d2;
              fVar2 = (pMVar33->matrix).d3;
              fVar3 = (pMVar33->matrix).d4;
              (this_00->mTransformation).d1 = (pMVar33->matrix).d1;
              (this_00->mTransformation).d2 = fVar1;
              (this_00->mTransformation).d3 = fVar2;
              (this_00->mTransformation).d4 = fVar3;
              (this_00->mTransformation).c1 = fVar4;
              (this_00->mTransformation).c2 = fVar5;
              (this_00->mTransformation).c3 = fVar6;
              (this_00->mTransformation).c4 = fVar7;
              (this_00->mTransformation).b1 = fVar8;
              (this_00->mTransformation).b2 = fVar9;
              (this_00->mTransformation).b3 = fVar10;
              (this_00->mTransformation).b4 = fVar11;
              (this_00->mTransformation).a1 = fVar12;
              (this_00->mTransformation).a2 = fVar13;
              (this_00->mTransformation).a3 = fVar14;
              (this_00->mTransformation).a4 = fVar15;
            }
            uVar37 = (ulong)pBVar38->iParent;
            if (uVar37 == 0xffffffff) {
              fVar12 = (this_00->mTransformation).a1;
              fVar13 = (this_00->mTransformation).a2;
              fVar14 = (this_00->mTransformation).a3;
              fVar15 = (this_00->mTransformation).a4;
              fVar8 = (this_00->mTransformation).b1;
              fVar9 = (this_00->mTransformation).b2;
              fVar10 = (this_00->mTransformation).b3;
              fVar11 = (this_00->mTransformation).b4;
              fVar4 = (this_00->mTransformation).c1;
              fVar5 = (this_00->mTransformation).c2;
              fVar6 = (this_00->mTransformation).c3;
              fVar7 = (this_00->mTransformation).c4;
              fVar1 = (this_00->mTransformation).d2;
              fVar2 = (this_00->mTransformation).d3;
              fVar3 = (this_00->mTransformation).d4;
              (pBVar38->mOffsetMatrix).d1 = (this_00->mTransformation).d1;
              (pBVar38->mOffsetMatrix).d2 = fVar1;
              (pBVar38->mOffsetMatrix).d3 = fVar2;
              (pBVar38->mOffsetMatrix).d4 = fVar3;
              (pBVar38->mOffsetMatrix).c1 = fVar4;
              (pBVar38->mOffsetMatrix).c2 = fVar5;
              (pBVar38->mOffsetMatrix).c3 = fVar6;
              (pBVar38->mOffsetMatrix).c4 = fVar7;
              (pBVar38->mOffsetMatrix).b1 = fVar8;
              (pBVar38->mOffsetMatrix).b2 = fVar9;
              (pBVar38->mOffsetMatrix).b3 = fVar10;
              (pBVar38->mOffsetMatrix).b4 = fVar11;
              (pBVar38->mOffsetMatrix).a1 = fVar12;
              (pBVar38->mOffsetMatrix).a2 = fVar13;
              (pBVar38->mOffsetMatrix).a3 = fVar14;
              (pBVar38->mOffsetMatrix).a4 = fVar15;
            }
            else {
              pBVar34 = (this->asBones).
                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              fVar1 = pBVar34[uVar37].mOffsetMatrix.a1;
              fVar2 = pBVar34[uVar37].mOffsetMatrix.a2;
              fVar3 = pBVar34[uVar37].mOffsetMatrix.a3;
              fVar4 = pBVar34[uVar37].mOffsetMatrix.a4;
              fVar5 = (this_00->mTransformation).b1;
              fVar6 = (this_00->mTransformation).a1;
              fVar7 = (this_00->mTransformation).a2;
              fVar8 = (this_00->mTransformation).c1;
              fVar9 = (this_00->mTransformation).d1;
              fVar10 = (this_00->mTransformation).b2;
              fVar11 = (this_00->mTransformation).c2;
              fVar12 = (this_00->mTransformation).d2;
              fVar13 = (this_00->mTransformation).b3;
              fVar14 = (this_00->mTransformation).a3;
              fVar15 = (this_00->mTransformation).c3;
              fVar16 = (this_00->mTransformation).d3;
              fVar17 = (this_00->mTransformation).b4;
              fVar18 = (this_00->mTransformation).a4;
              fVar19 = (this_00->mTransformation).c4;
              fVar20 = (this_00->mTransformation).d4;
              fVar21 = pBVar34[uVar37].mOffsetMatrix.b2;
              fVar22 = pBVar34[uVar37].mOffsetMatrix.b1;
              fVar23 = pBVar34[uVar37].mOffsetMatrix.b3;
              fVar24 = pBVar34[uVar37].mOffsetMatrix.b4;
              fVar25 = pBVar34[uVar37].mOffsetMatrix.c2;
              fVar26 = pBVar34[uVar37].mOffsetMatrix.c1;
              fVar27 = pBVar34[uVar37].mOffsetMatrix.c3;
              fVar28 = pBVar34[uVar37].mOffsetMatrix.c4;
              fVar29 = pBVar34[uVar37].mOffsetMatrix.d2;
              fVar30 = pBVar34[uVar37].mOffsetMatrix.d1;
              fVar31 = pBVar34[uVar37].mOffsetMatrix.d3;
              fVar32 = pBVar34[uVar37].mOffsetMatrix.d4;
              (pBVar38->mOffsetMatrix).a1 =
                   fVar9 * fVar4 + fVar8 * fVar3 + fVar6 * fVar1 + fVar2 * fVar5;
              (pBVar38->mOffsetMatrix).a2 =
                   fVar12 * fVar4 + fVar11 * fVar3 + fVar7 * fVar1 + fVar2 * fVar10;
              (pBVar38->mOffsetMatrix).a3 =
                   fVar16 * fVar4 + fVar15 * fVar3 + fVar14 * fVar1 + fVar2 * fVar13;
              (pBVar38->mOffsetMatrix).a4 =
                   fVar4 * fVar20 + fVar3 * fVar19 + fVar1 * fVar18 + fVar2 * fVar17;
              (pBVar38->mOffsetMatrix).b1 =
                   fVar9 * fVar24 + fVar8 * fVar23 + fVar6 * fVar22 + fVar21 * fVar5;
              (pBVar38->mOffsetMatrix).b2 =
                   fVar12 * fVar24 + fVar11 * fVar23 + fVar7 * fVar22 + fVar21 * fVar10;
              (pBVar38->mOffsetMatrix).b3 =
                   fVar16 * fVar24 + fVar15 * fVar23 + fVar14 * fVar22 + fVar21 * fVar13;
              (pBVar38->mOffsetMatrix).b4 =
                   fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * fVar17;
              (pBVar38->mOffsetMatrix).c1 =
                   fVar9 * fVar28 + fVar8 * fVar27 + fVar6 * fVar26 + fVar25 * fVar5;
              (pBVar38->mOffsetMatrix).c2 =
                   fVar12 * fVar28 + fVar11 * fVar27 + fVar7 * fVar26 + fVar25 * fVar10;
              (pBVar38->mOffsetMatrix).c3 =
                   fVar16 * fVar28 + fVar15 * fVar27 + fVar14 * fVar26 + fVar25 * fVar13;
              (pBVar38->mOffsetMatrix).c4 =
                   fVar28 * fVar20 + fVar27 * fVar19 + fVar26 * fVar18 + fVar25 * fVar17;
              (pBVar38->mOffsetMatrix).d1 =
                   fVar9 * fVar32 + fVar8 * fVar31 + fVar6 * fVar30 + fVar5 * fVar29;
              (pBVar38->mOffsetMatrix).d2 =
                   fVar12 * fVar32 + fVar11 * fVar31 + fVar7 * fVar30 + fVar10 * fVar29;
              (pBVar38->mOffsetMatrix).d3 =
                   fVar16 * fVar32 + fVar15 * fVar31 + fVar14 * fVar30 + fVar13 * fVar29;
              (pBVar38->mOffsetMatrix).d4 =
                   fVar20 * fVar32 + fVar19 * fVar31 + fVar18 * fVar30 + fVar29 * fVar17;
            }
            local_78 = local_78 + 1;
            this_00->mParent = pcNode;
            AddBoneChildren(this,this_00,uVar35 - 1);
          }
          uVar37 = (ulong)uVar35;
          pBVar38 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar39 = ((long)(this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pBVar38 >> 4) *
                   -0x71c71c71c71c71c7;
          uVar35 = uVar35 + 1;
        } while (uVar37 <= uVar39 && uVar39 - uVar37 != 0);
      }
      return;
    }
    __assert_fail("nullptr == pcNode->mChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19c,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  __assert_fail("0 == pcNode->mNumChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SMD/SMDLoader.cpp"
                ,0x19b,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
}

Assistant:

void SMDImporter::AddBoneChildren(aiNode* pcNode, uint32_t iParent) {
    ai_assert( nullptr != pcNode );
    ai_assert( 0 == pcNode->mNumChildren );
    ai_assert( nullptr == pcNode->mChildren);

    // first count ...
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent == iParent) {
            ++pcNode->mNumChildren;
        }
    }

    // now allocate the output array
    pcNode->mChildren = new aiNode*[pcNode->mNumChildren];

    // and fill all subnodes
    unsigned int qq( 0 );
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent != iParent) {
            continue;
        }

        aiNode* pc = pcNode->mChildren[qq++] = new aiNode();
        pc->mName.Set(bone.mName);

        // store the local transformation matrix of the bind pose
        if (bone.sAnim.asKeys.size()) {
            pc->mTransformation = bone.sAnim.asKeys[0].matrix;
        }

        if (bone.iParent == static_cast<uint32_t>(-1)) { 
            bone.mOffsetMatrix = pc->mTransformation;
        } else {
            bone.mOffsetMatrix = asBones[bone.iParent].mOffsetMatrix * pc->mTransformation;
        }

        pc->mParent = pcNode;

        // add children to this node, too
        AddBoneChildren(pc,i);
    }
}